

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O0

void __thiscall
StunMsgEncode_RFC5769SampleIPv6Response_Test::TestBody
          (StunMsgEncode_RFC5769SampleIPv6Response_Test *this)

{
  bool bVar1;
  base_message<std::allocator<unsigned_char>_> *pbVar2;
  char *pcVar3;
  uint8_t *vec_b;
  pointer pdVar4;
  char *pcVar5;
  char *in_R9;
  xor_socket_address xVar6;
  iterator iVar7;
  string local_658;
  AssertHelper local_638;
  Message local_630;
  decoded local_628;
  decoded local_618;
  undefined1 local_608 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_5d8;
  Message local_5d0;
  attribute_base<_stun_attr_uint32> local_5c8;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar__7;
  Message local_5a0;
  uint16_t local_596;
  attribute_type local_594;
  undefined1 local_590 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_560;
  Message local_558;
  decoded local_550;
  decoded local_540;
  undefined1 local_530 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_500;
  Message local_4f8;
  allocator<char> local_4e9;
  string local_4e8;
  attribute_base<_stun_attr_msgint> local_4c8;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar__5;
  Message local_4a0;
  uint16_t local_496;
  attribute_type local_494;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_460;
  Message local_458;
  decoded local_450;
  decoded local_440;
  undefined1 local_430 [8];
  AssertionResult gtest_ar__4;
  Message local_418;
  int local_410 [2];
  undefined1 local_408 [8];
  AssertionResult gtest_ar_7;
  Message local_3f0;
  uint16_t local_3e2;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_6;
  Message local_3c8;
  int local_3bc;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_388;
  Message local_380;
  attribute_base<_stun_attr_sockaddr> local_378;
  undefined1 local_368 [8];
  AssertionResult gtest_ar__3;
  sockaddr_in6 test_addr;
  Message local_330;
  uint16_t local_326;
  attribute_type local_324;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_2f0;
  Message local_2e8;
  decoded local_2e0;
  decoded local_2d0;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar__2;
  Message local_2a8;
  attribute_base<_stun_attr_varsize> local_2a0;
  string local_290;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_3;
  Message local_258;
  uint16_t local_24e;
  attribute_type local_24c;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_218;
  Message local_210;
  decoded local_208;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__1;
  iterator i;
  Message local_1d0;
  uint16_t local_1c6;
  type local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_190;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_168;
  Message local_160;
  size_t local_158;
  unsigned_long local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  msgint local_130;
  xor_socket_address local_120 [2];
  varsize<char> local_100;
  undefined1 local_e0 [8];
  message message;
  sockaddr_in6 ipv6;
  uint8_t tsx_id [12];
  uint8_t expected_result [92];
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  char password [23];
  char software_name [12];
  StunMsgEncode_RFC5769SampleIPv6Response_Test *this_local;
  
  stack0xffffffffffffffe0 = 0x6365762074736574;
  password[8] = 'W';
  password[9] = 'v';
  password[10] = 'J';
  password[0xb] = 'x';
  password[0xc] = 'B';
  password[0xd] = 't';
  password[0xe] = '\0';
  builtin_memcpy(expected_result + 0x58,"VOkJ",4);
  cStack_34 = 'x';
  cStack_33 = 'b';
  cStack_32 = 'R';
  cStack_31 = 'l';
  password[0] = '1';
  password[1] = 'R';
  password[2] = 'm';
  password[3] = 'T';
  password[4] = 'x';
  password[5] = 'U';
  password[6] = 'k';
  password[7] = '/';
  expected_result[0x48] = 0xbf;
  expected_result[0x49] = 0xe3;
  expected_result[0x4a] = 0xed;
  expected_result[0x4b] = 'A';
  expected_result[0x4c] = 0x80;
  expected_result[0x4d] = '(';
  expected_result[0x4e] = '\0';
  expected_result[0x4f] = '\x04';
  expected_result[0x50] = 200;
  expected_result[0x51] = 0xfb;
  expected_result[0x52] = '\v';
  expected_result[0x53] = 'L';
  expected_result[0x38] = 0xa3;
  expected_result[0x39] = 0x82;
  expected_result[0x3a] = 0x95;
  expected_result[0x3b] = 'N';
  expected_result[0x3c] = 'K';
  expected_result[0x3d] = 0xe6;
  expected_result[0x3e] = '{';
  expected_result[0x3f] = 0xf1;
  expected_result[0x40] = '\x17';
  expected_result[0x41] = 0x84;
  expected_result[0x42] = 0xc9;
  expected_result[0x43] = '|';
  expected_result[0x44] = 0x82;
  expected_result[0x45] = 0x92;
  expected_result[0x46] = 0xc2;
  expected_result[0x47] = 'u';
  expected_result[0x28] = 0xa5;
  expected_result[0x29] = 0xd3;
  expected_result[0x2a] = 0xf1;
  expected_result[0x2b] = 'y';
  expected_result[0x2c] = 0xbc;
  expected_result[0x2d] = '%';
  expected_result[0x2e] = 0xf4;
  expected_result[0x2f] = 0xb5;
  expected_result[0x30] = 0xbe;
  expected_result[0x31] = 0xd2;
  expected_result[0x32] = 0xb9;
  expected_result[0x33] = 0xd9;
  expected_result[0x34] = '\0';
  expected_result[0x35] = '\b';
  expected_result[0x36] = '\0';
  expected_result[0x37] = '\x14';
  builtin_memcpy(expected_result + 0x18,"tor ",5);
  expected_result[0x1d] = ' ';
  expected_result[0x1e] = '\0';
  expected_result[0x1f] = '\x14';
  expected_result[0x20] = '\0';
  expected_result[0x21] = '\x02';
  expected_result[0x22] = 0xa1;
  expected_result[0x23] = 'G';
  expected_result[0x24] = '\x01';
  expected_result[0x25] = '\x13';
  expected_result[0x26] = 0xa9;
  expected_result[0x27] = 0xfa;
  expected_result[8] = 0xfa;
  expected_result[9] = 0x87;
  expected_result[10] = 0xdf;
  expected_result[0xb] = 0xae;
  expected_result[0xc] = 0x80;
  expected_result[0xd] = '\"';
  expected_result[0xe] = '\0';
  expected_result[0xf] = '\v';
  expected_result[0x10] = 't';
  expected_result[0x11] = 'e';
  expected_result[0x12] = 's';
  expected_result[0x13] = 't';
  expected_result[0x14] = ' ';
  expected_result[0x15] = 'v';
  expected_result[0x16] = 'e';
  expected_result[0x17] = 'c';
  stack0xffffffffffffff68 = 0x42a4122148000101;
  expected_result[0] = 0xb7;
  expected_result[1] = 0xe7;
  expected_result[2] = 0xa7;
  expected_result[3] = '\x01';
  expected_result[4] = 0xbc;
  expected_result[5] = '4';
  expected_result[6] = 0xd6;
  expected_result[7] = 0x86;
  ipv6._20_8_ = 0x86d634bc01a7e7b7;
  tsx_id[0] = 0xfa;
  tsx_id[1] = 0x87;
  tsx_id[2] = 0xdf;
  tsx_id[3] = 0xae;
  message.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_2_ = 10;
  message.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_2_ = htons(0x8055);
  inet_pton(10,"2001:db8:1234:5678:11:2233:4455:6677",&ipv6);
  stun::base_message<std::allocator<unsigned_char>_>::base_message
            ((base_message<std::allocator<unsigned_char>_> *)local_e0,0x101,
             ipv6.sin6_addr.__in6_u.__u6_addr8 + 0xc);
  stun::attribute::software(&local_100,password + 0x10,' ');
  pbVar2 = stun::operator<<((base_message<std::allocator<unsigned_char>_> *)local_e0,&local_100);
  xVar6 = stun::attribute::xor_mapped_address
                    ((sockaddr_in6 *)
                     ((long)&message.buffer_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_120[0].addr_ = xVar6.addr_;
  local_120[0].type_ = xVar6.type_;
  pbVar2 = stun::operator<<(pbVar2,local_120);
  local_130 = stun::attribute::message_integrity((char *)(expected_result + 0x58));
  pbVar2 = stun::operator<<(pbVar2,&local_130);
  stun::attribute::fingerprint();
  stun::operator<<(pbVar2,(fingerprint *)((long)&gtest_ar.message_.ptr_ + 7));
  local_150 = 0x5c;
  local_158 = stun::base_message<std::allocator<unsigned_char>_>::size
                        ((base_message<std::allocator<unsigned_char>_> *)local_e0);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_148,"sizeof(expected_result)","message.size()",&local_150,
             &local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x13f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message(&local_160);
  }
  gtest_ar_.message_.ptr_._5_3_ = 0;
  gtest_ar_.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  if (gtest_ar_.message_.ptr_._4_4_ == 0) {
    vec_b = stun::base_message<std::allocator<unsigned_char>_>::data
                      ((base_message<std::allocator<unsigned_char>_> *)local_e0);
    anon_unknown.dwarf_f3ff::IsEqual((anon_unknown_dwarf_f3ff *)local_180,tsx_id + 8,vec_b,0x5c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar1) {
      testing::Message::Message(&local_188);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_180,
                 (AssertionResult *)
                 "IsEqual(expected_result, message.data(), sizeof(expected_result))","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x141,pcVar3);
      testing::internal::AssertHelper::operator=(&local_190,&local_188);
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_188);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    local_1c4 = binding_response;
    local_1c6 = stun::base_message<std::allocator<unsigned_char>_>::type
                          ((base_message<std::allocator<unsigned_char>_> *)local_e0);
    testing::internal::EqHelper<false>::
    Compare<stun::base_message<std::allocator<unsigned_char>>::type,unsigned_short>
              ((EqHelper<false> *)local_1c0,"stun::message::binding_response","message.type()",
               &local_1c4,&local_1c6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
    if (!bVar1) {
      testing::Message::Message(&local_1d0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&i.attr_.attr_hdr_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x145,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&i.attr_.attr_hdr_,&local_1d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i.attr_.attr_hdr_);
      testing::Message::~Message(&local_1d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
    iVar7 = stun::base_message<std::allocator<unsigned_char>_>::begin
                      ((base_message<std::allocator<unsigned_char>_> *)local_e0);
    i.attr_.msg_hdr_ = (stun_msg_hdr *)iVar7.attr_.attr_hdr_;
    gtest_ar__1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar7.attr_.msg_hdr_;
    local_208 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                   ((base_message<std::allocator<unsigned_char>_> *)local_e0);
    bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                      ((iterator *)&local_208,(self_type *)&gtest_ar__1.message_);
    testing::AssertionResult::AssertionResult((AssertionResult *)local_1f8,bVar1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
    if (!bVar1) {
      testing::Message::Message(&local_210);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_2.message_,(internal *)local_1f8,
                 (AssertionResult *)"message.end() != i","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_218,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x148,pcVar3);
      testing::internal::AssertHelper::operator=(&local_218,&local_210);
      testing::internal::AssertHelper::~AssertHelper(&local_218);
      std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_210);
    }
    gtest_ar_.message_.ptr_._5_3_ = 0;
    gtest_ar_.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
    if (gtest_ar_.message_.ptr_._4_4_ == 0) {
      local_24c = software;
      pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                         ((iterator *)&gtest_ar__1.message_);
      local_24e = stun::attribute::decoded::type(pdVar4);
      testing::internal::EqHelper<false>::
      Compare<stun::attribute::type::attribute_type,unsigned_short>
                ((EqHelper<false> *)local_248,"type::software","i->type()",&local_24c,&local_24e);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
      if (!bVar1) {
        testing::Message::Message(&local_258);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x149,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_258);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_258);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
      pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                         ((iterator *)&gtest_ar__1.message_);
      local_2a0 = (attribute_base<_stun_attr_varsize>)
                  stun::attribute::decoded::to<(stun::attribute::type::attribute_type)32802>(pdVar4)
      ;
      stun::attribute::decoding_bits::string::to_string_abi_cxx11_(&local_290,(string *)&local_2a0);
      testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
                ((EqHelper<false> *)local_270,"software_name","i->to<type::software>().to_string()",
                 (char (*) [12])(password + 0x10),&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
      if (!bVar1) {
        testing::Message::Message(&local_2a8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x14b,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_2a8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_2a8);
      }
      gtest_ar_.message_.ptr_._5_3_ = 0;
      gtest_ar_.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
      if (gtest_ar_.message_.ptr_._4_4_ == 0) {
        local_2d0 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                       ((base_message<std::allocator<unsigned_char>_> *)local_e0);
        local_2e0 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator::
                             operator++((iterator *)&gtest_ar__1.message_);
        bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                          ((iterator *)&local_2d0,(self_type *)&local_2e0);
        testing::AssertionResult::AssertionResult((AssertionResult *)local_2c0,bVar1);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
        if (!bVar1) {
          testing::Message::Message(&local_2e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_4.message_,(internal *)local_2c0,
                     (AssertionResult *)"message.end() != ++i","false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_2f0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                     ,0x14d,pcVar3);
          testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
          testing::internal::AssertHelper::~AssertHelper(&local_2f0);
          std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_2e8);
        }
        gtest_ar_.message_.ptr_._5_3_ = 0;
        gtest_ar_.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
        if (gtest_ar_.message_.ptr_._4_4_ == 0) {
          local_324 = xor_mapped_address;
          pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                             ((iterator *)&gtest_ar__1.message_);
          local_326 = stun::attribute::decoded::type(pdVar4);
          testing::internal::EqHelper<false>::
          Compare<stun::attribute::type::attribute_type,unsigned_short>
                    ((EqHelper<false> *)local_320,"type::xor_mapped_address","i->type()",&local_324,
                     &local_326);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
          if (!bVar1) {
            testing::Message::Message(&local_330);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&test_addr.sin6_scope_id,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0x14e,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&test_addr.sin6_scope_id,&local_330);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test_addr.sin6_scope_id)
            ;
            testing::Message::~Message(&local_330);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
          test_addr.sin6_addr.__in6_u.__u6_addr32[0] = 0;
          test_addr.sin6_addr.__in6_u._4_8_ = 0;
          gtest_ar__3.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          test_addr.sin6_family = 0;
          test_addr.sin6_port = 0;
          test_addr.sin6_flowinfo = 0;
          pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                             ((iterator *)&gtest_ar__1.message_);
          local_378 = (attribute_base<_stun_attr_sockaddr>)
                      stun::attribute::decoded::to<(stun::attribute::type::attribute_type)32>
                                (pdVar4);
          bVar1 = stun::attribute::decoding_bits::xor_socket_address::to_sockaddr
                            ((xor_socket_address *)&local_378,(sockaddr *)&gtest_ar__3.message_);
          testing::AssertionResult::AssertionResult((AssertionResult *)local_368,bVar1);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
          if (!bVar1) {
            testing::Message::Message(&local_380);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_5.message_,(internal *)local_368,
                       (AssertionResult *)
                       "i->to<type::xor_mapped_address>().to_sockaddr((sockaddr*)&test_addr)",
                       "false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_388,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0x152,pcVar3);
            testing::internal::AssertHelper::operator=(&local_388,&local_380);
            testing::internal::AssertHelper::~AssertHelper(&local_388);
            std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_380);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
          local_3bc = 10;
          testing::internal::EqHelper<false>::Compare<int,unsigned_short>
                    ((EqHelper<false> *)local_3b8,"10","test_addr.sin6_family",&local_3bc,
                     (unsigned_short *)&gtest_ar__3.message_);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
          if (!bVar1) {
            testing::Message::Message(&local_3c8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0x153,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_6.message_,&local_3c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
            testing::Message::~Message(&local_3c8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
          local_3e2 = htons(0x8055);
          testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_short>
                    ((EqHelper<false> *)local_3e0,"htons(32853)","test_addr.sin6_port",&local_3e2,
                     (unsigned_short *)((long)&gtest_ar__3.message_.ptr_ + 2));
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
          if (!bVar1) {
            testing::Message::Message(&local_3f0);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0x154,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_7.message_,&local_3f0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
            testing::Message::~Message(&local_3f0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
          local_410[1] = 0;
          local_410[0] = memcmp(&test_addr,&ipv6,0x10);
          pcVar3 = (char *)0x0;
          testing::internal::EqHelper<true>::Compare<int,int>
                    (local_408,"0",
                     (int *)"memcmp(&test_addr.sin6_addr, &ipv6.sin6_addr, sizeof(ipv6.sin6_addr))",
                     local_410 + 1,local_410);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
          if (!bVar1) {
            testing::Message::Message(&local_418);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0x156,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__4.message_,&local_418);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
            testing::Message::~Message(&local_418);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
          local_440 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                         ((base_message<std::allocator<unsigned_char>_> *)local_e0);
          local_450 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator::
                               operator++((iterator *)&gtest_ar__1.message_);
          bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                            ((iterator *)&local_440,(self_type *)&local_450);
          testing::AssertionResult::AssertionResult((AssertionResult *)local_430,bVar1);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
          if (!bVar1) {
            testing::Message::Message(&local_458);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_8.message_,(internal *)local_430,
                       (AssertionResult *)"message.end() != ++i","false","true",pcVar3);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_460,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0x158,pcVar5);
            testing::internal::AssertHelper::operator=(&local_460,&local_458);
            testing::internal::AssertHelper::~AssertHelper(&local_460);
            std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
            testing::Message::~Message(&local_458);
          }
          gtest_ar_.message_.ptr_._5_3_ = 0;
          gtest_ar_.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
          if (gtest_ar_.message_.ptr_._4_4_ == 0) {
            local_494 = message_integrity;
            pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                               ((iterator *)&gtest_ar__1.message_);
            local_496 = stun::attribute::decoded::type(pdVar4);
            testing::internal::EqHelper<false>::
            Compare<stun::attribute::type::attribute_type,unsigned_short>
                      ((EqHelper<false> *)local_490,"type::message_integrity","i->type()",&local_494
                       ,&local_496);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
            if (!bVar1) {
              testing::Message::Message(&local_4a0);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                         ,0x159,pcVar5);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__5.message_,&local_4a0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
              testing::Message::~Message(&local_4a0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
            pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                               ((iterator *)&gtest_ar__1.message_);
            local_4c8 = (attribute_base<_stun_attr_msgint>)
                        stun::attribute::decoded::to<(stun::attribute::type::attribute_type)8>
                                  (pdVar4);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4e8,(char *)(expected_result + 0x58),&local_4e9);
            bVar1 = stun::attribute::decoding_bits::msgint::check_integrity
                              ((msgint *)&local_4c8,&local_4e8);
            testing::AssertionResult::AssertionResult((AssertionResult *)local_4b8,bVar1);
            std::__cxx11::string::~string((string *)&local_4e8);
            std::allocator<char>::~allocator(&local_4e9);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
            if (!bVar1) {
              testing::Message::Message(&local_4f8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_4b8,
                         (AssertionResult *)
                         "i->to<type::message_integrity>().check_integrity(password)","false","true"
                         ,pcVar3);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_500,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                         ,0x15b,pcVar5);
              testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
              testing::internal::AssertHelper::~AssertHelper(&local_500);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_4f8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
            local_540 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                           ((base_message<std::allocator<unsigned_char>_> *)local_e0
                                           );
            local_550 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator::
                                 operator++((iterator *)&gtest_ar__1.message_);
            bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                              ((iterator *)&local_540,(self_type *)&local_550);
            testing::AssertionResult::AssertionResult((AssertionResult *)local_530,bVar1);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
            if (!bVar1) {
              testing::Message::Message(&local_558);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_9.message_,(internal *)local_530,
                         (AssertionResult *)"message.end() != ++i","false","true",pcVar3);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_560,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                         ,0x15d,pcVar5);
              testing::internal::AssertHelper::operator=(&local_560,&local_558);
              testing::internal::AssertHelper::~AssertHelper(&local_560);
              std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
              testing::Message::~Message(&local_558);
            }
            gtest_ar_.message_.ptr_._5_3_ = 0;
            gtest_ar_.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
            if (gtest_ar_.message_.ptr_._4_4_ == 0) {
              local_594 = fingerprint;
              pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                                 ((iterator *)&gtest_ar__1.message_);
              local_596 = stun::attribute::decoded::type(pdVar4);
              testing::internal::EqHelper<false>::
              Compare<stun::attribute::type::attribute_type,unsigned_short>
                        ((EqHelper<false> *)local_590,"type::fingerprint","i->type()",&local_594,
                         &local_596);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
              if (!bVar1) {
                testing::Message::Message(&local_5a0);
                pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_590);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__7.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                           ,0x15e,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__7.message_,&local_5a0);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_5a0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
              pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                                 ((iterator *)&gtest_ar__1.message_);
              local_5c8 = (attribute_base<_stun_attr_uint32>)
                          stun::attribute::decoded::to<(stun::attribute::type::attribute_type)32808>
                                    (pdVar4);
              bVar1 = stun::attribute::decoding_bits::fingerprint::check_integrity
                                ((fingerprint *)&local_5c8);
              testing::AssertionResult::AssertionResult((AssertionResult *)local_5b8,bVar1);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b8);
              if (!bVar1) {
                testing::Message::Message(&local_5d0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__8.message_,(internal *)local_5b8,
                           (AssertionResult *)"i->to<type::fingerprint>().check_integrity()","false"
                           ,"true",pcVar3);
                pcVar5 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_5d8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                           ,0x160,pcVar5);
                testing::internal::AssertHelper::operator=(&local_5d8,&local_5d0);
                testing::internal::AssertHelper::~AssertHelper(&local_5d8);
                std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                testing::Message::~Message(&local_5d0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
              local_618 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                             ((base_message<std::allocator<unsigned_char>_> *)
                                              local_e0);
              local_628 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator::
                                   operator++((iterator *)&gtest_ar__1.message_);
              bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator==
                                ((iterator *)&local_618,(self_type *)&local_628);
              testing::AssertionResult::AssertionResult((AssertionResult *)local_608,bVar1);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_608);
              if (!bVar1) {
                testing::Message::Message(&local_630);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_658,(internal *)local_608,
                           (AssertionResult *)"message.end() == ++i","false","true",pcVar3);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_638,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                           ,0x162,pcVar3);
                testing::internal::AssertHelper::operator=(&local_638,&local_630);
                testing::internal::AssertHelper::~AssertHelper(&local_638);
                std::__cxx11::string::~string((string *)&local_658);
                testing::Message::~Message(&local_630);
              }
              gtest_ar_.message_.ptr_._5_3_ = 0;
              gtest_ar_.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_608);
              if (gtest_ar_.message_.ptr_._4_4_ == 0) {
                gtest_ar_.message_.ptr_._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  stun::base_message<std::allocator<unsigned_char>_>::~base_message
            ((base_message<std::allocator<unsigned_char>_> *)local_e0);
  return;
}

Assistant:

TEST(StunMsgEncode, RFC5769SampleIPv6Response) {
  const char software_name[] = "test vector";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x01,0x01,0x00,0x48, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x0b, //    SOFTWARE attribute header
    0x74,0x65,0x73,0x74, // }
    0x20,0x76,0x65,0x63, // }  UTF-8 server name
    0x74,0x6f,0x72,0x20, // }
    0x00,0x20,0x00,0x14, //    XOR-MAPPED-ADDRESS attribute header
    0x00,0x02,0xa1,0x47, //    Address family (IPv4) and xor'd mapped port number
    0x01,0x13,0xa9,0xfa, // }
    0xa5,0xd3,0xf1,0x79, // }  Xor'd mapped IPv6 address
    0xbc,0x25,0xf4,0xb5, // }
    0xbe,0xd2,0xb9,0xd9, // }
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0xa3,0x82,0x95,0x4e, // }
    0x4b,0xe6,0x7b,0xf1, // }
    0x17,0x84,0xc9,0x7c, // }  HMAC-SHA1 fingerprint
    0x82,0x92,0xc2,0x75, // }
    0xbf,0xe3,0xed,0x41, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xc8,0xfb,0x0b,0x4c, //    CRC32 fingerprint
  };

  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  sockaddr_in6 ipv6;
  ipv6.sin6_family = AF_INET6;
  ipv6.sin6_port = htons(32853);
  inet_pton(AF_INET6, "2001:db8:1234:5678:11:2233:4455:6677", &ipv6.sin6_addr);

  stun::message message(stun::message::binding_response, tsx_id);
  message << stun::attribute::software(software_name, ' ')
          << stun::attribute::xor_mapped_address(ipv6)
          << stun::attribute::message_integrity(password)
          << stun::attribute::fingerprint();
  ASSERT_EQ(sizeof(expected_result), message.size());
  EXPECT_TRUE(IsEqual(expected_result, message.data(),
      sizeof(expected_result)));

  // Now decoding
  using namespace stun::attribute;
  EXPECT_EQ(stun::message::binding_response, message.type());

  stun::message::iterator i = message.begin();
  ASSERT_TRUE(message.end() != i);
  EXPECT_EQ(type::software, i->type());
  ASSERT_EQ(software_name,
    i->to<type::software>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::xor_mapped_address, i->type());
  sockaddr_in6 test_addr;
  memset(&test_addr, 0, sizeof(test_addr));
  EXPECT_TRUE(
    i->to<type::xor_mapped_address>().to_sockaddr((sockaddr*)&test_addr));
  EXPECT_EQ(AF_INET6, test_addr.sin6_family);
  EXPECT_EQ(htons(32853), test_addr.sin6_port);
  EXPECT_EQ(0, memcmp(&test_addr.sin6_addr, &ipv6.sin6_addr,
      sizeof(ipv6.sin6_addr)));

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::message_integrity, i->type());
  EXPECT_TRUE(
    i->to<type::message_integrity>().check_integrity(password));

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::fingerprint, i->type());
  EXPECT_TRUE(
    i->to<type::fingerprint>().check_integrity());

  ASSERT_TRUE(message.end() == ++i);
}